

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_setsaneconfig(char *args)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  char *ptr;
  int arcsFirst;
  int inclCD;
  char *arcExt;
  char *appName;
  char *org;
  char *args_local;
  
  pcVar4 = strchr(args,0x20);
  *pcVar4 = '\0';
  _arcsFirst = strchr(pcVar4 + 1,0x20);
  *_arcsFirst = '\0';
  _arcsFirst = _arcsFirst + 1;
  pcVar5 = strchr(_arcsFirst,0x20);
  *pcVar5 = '\0';
  iVar1 = atoi(_arcsFirst);
  iVar2 = atoi(pcVar5 + 1);
  iVar3 = strcmp(_arcsFirst,"!");
  if (iVar3 == 0) {
    _arcsFirst = (char *)0x0;
  }
  iVar1 = PHYSFS_setSaneConfig(args,pcVar4 + 1,_arcsFirst,iVar1,iVar2);
  if (iVar1 == 0) {
    uVar6 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar6);
  }
  else {
    printf("Successful.\n");
  }
  return 1;
}

Assistant:

static int cmd_setsaneconfig(char *args)
{
    char *org;
    char *appName;
    char *arcExt;
    int inclCD;
    int arcsFirst;
    char *ptr = args;

        /* ugly. */
    org = ptr;
    ptr = strchr(ptr, ' '); *ptr = '\0'; ptr++; appName = ptr;
    ptr = strchr(ptr, ' '); *ptr = '\0'; ptr++; arcExt = ptr;
    ptr = strchr(ptr, ' '); *ptr = '\0'; ptr++; inclCD = atoi(arcExt);
    arcsFirst = atoi(ptr);

    if (strcmp(arcExt, "!") == 0)
        arcExt = NULL;

    if (PHYSFS_setSaneConfig(org, appName, arcExt, inclCD, arcsFirst))
        printf("Successful.\n");
    else
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());

    return 1;
}